

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O0

void absl::lts_20250127::ascii_internal::AsciiStrCaseFold<false>
               (Nonnull<char_*> dst,Nullable<const_char_*> src,size_t size)

{
  size_t size_local;
  Nullable<const_char_*> src_local;
  Nonnull<char_*> dst_local;
  
  if (size < 0x10) {
    AsciiStrCaseFoldImpl<false,true>(dst,src,size);
  }
  else {
    AsciiStrCaseFoldImpl<false,false>(dst,src,size);
  }
  return;
}

Assistant:

constexpr void AsciiStrCaseFold(absl::Nonnull<char*> dst,
                                absl::Nullable<const char*> src, size_t size) {
  size < 16 ? AsciiStrCaseFoldImpl<ToUpper, /*Naive=*/true>(dst, src, size)
            : AsciiStrCaseFoldImpl<ToUpper, /*Naive=*/false>(dst, src, size);
}